

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
          (NLFeeder_Easy *this,int i,SingleSparseVecWrtFactory<int,_double> *svw)

{
  long lVar1;
  int in_ESI;
  NLFeeder_Easy *in_RDI;
  size_t pos;
  SparseVectorWriter<int,_double> sv;
  size_t end;
  size_t start;
  NLW2_SparseMatrix_C A;
  long lVar2;
  size_t in_stack_ffffffffffffff90;
  SingleSparseVecWrtFactory<int,_double> *in_stack_ffffffffffffff98;
  SparseVectorWriter<int,_double> local_60;
  long local_50;
  long local_48;
  int local_40;
  long local_38;
  long local_30;
  int local_c;
  
  local_c = in_ESI;
  NLME(in_RDI);
  NLModel::GetA(&in_RDI->nlme_);
  local_48 = *(long *)(local_30 + (long)local_c * 8);
  lVar2 = local_38;
  if (local_c < local_40 + -1) {
    lVar2 = *(long *)(local_30 + (long)(local_c + 1) * 8);
  }
  if (local_48 != lVar2) {
    local_50 = lVar2;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    for (lVar1 = local_48; lVar1 != local_50; lVar1 = lVar1 + 1) {
      VPerm(in_RDI,(int)((ulong)lVar2 >> 0x20));
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
      SparseVectorWriter<int,_double>::Write
                ((SparseVectorWriter<int,_double> *)in_RDI,(int)((ulong)lVar2 >> 0x20),
                 5.75015831584106e-318);
    }
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
    SparseVectorWriter<int,_double>::~SparseVectorWriter(&local_60);
  }
  return;
}

Assistant:

void FeedLinearConExpr(int i, ConLinearExprWriterFactory& svw) {
    auto A = NLME().GetA();
    assert(!A.num_nz_ || NLW2_MatrixFormatRowwise == A.format_);
    assert(NLME().NumRows() == A.num_colrow_);
    auto start = A.start_[i];
    auto end = (i < A.num_colrow_-1) ? A.start_[i+1] : A.num_nz_;
    if (start!=end) {
      auto sv = svw.MakeVectorWriter(end-start);
      for (auto pos=start; pos!=end; ++pos)
        sv.Write(VPerm(A.index_[pos]), A.value_[pos]);
    }
  }